

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ParseError *e;
  allocator local_209;
  string local_208;
  undefined1 local_1e8 [8];
  App app;
  char **argv_local;
  int argc_local;
  
  app.config_ptr_ = (Option *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"...",&local_209);
  CLI::App::App((App *)local_1e8,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  setup_subcommand_a((App *)local_1e8);
  CLI::App::require_subcommand((App *)local_1e8);
  CLI::App::parse((App *)local_1e8,argc,(char **)app.config_ptr_);
  CLI::App::~App((App *)local_1e8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::App app{"..."};

    // Call the setup functions for the subcommands.
    // They are kept alive by a shared pointer in the
    // lambda function held by CLI11
    setup_subcommand_a(app);

    // Make sure we get at least one subcommand
    app.require_subcommand();

    // More setup if needed, i.e., other subcommands etc.

    CLI11_PARSE(app, argc, argv);

    return 0;
}